

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

bool __thiscall rw::Light::streamWrite(Light *this,Stream *stream)

{
  uint32 size;
  float __x;
  float32 local_30;
  float32 local_2c;
  LightChunkData buf;
  Stream *stream_local;
  Light *this_local;
  
  buf._16_8_ = stream;
  size = streamGetSize(this);
  writeChunkHeader(stream,0x12,size);
  writeChunkHeader((Stream *)buf._16_8_,1,0x18);
  local_30 = this->radius;
  local_2c = (this->color).red;
  buf.radius = (this->color).green;
  buf.red = (this->color).blue;
  if (version < 0x30300) {
    __x = acosf(-(float)this->minusCosAngle);
    buf.green = (float32)tanf(__x);
  }
  else {
    buf.green = this->minusCosAngle;
  }
  buf.blue = (float32)((uint)(this->object).object.flags |
                      (uint)(this->object).object.subType << 0x10);
  Stream::write32((Stream *)buf._16_8_,&local_30,0x18);
  PluginList::streamWrite((PluginList *)&s_plglist,(Stream *)buf._16_8_,this);
  return true;
}

Assistant:

bool
Light::streamWrite(Stream *stream)
{
	LightChunkData buf;
	writeChunkHeader(stream, ID_LIGHT, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, sizeof(LightChunkData));
	buf.radius = this->radius;
	buf.red   = this->color.red;
	buf.green = this->color.green;
	buf.blue  = this->color.blue;
	if(version >= 0x30300)
		buf.minusCosAngle = this->minusCosAngle;
	else
		buf.minusCosAngle = tanf(acosf(-this->minusCosAngle));
	buf.type_flags = (uint32)this->object.object.flags |
		(uint32)this->object.object.subType << 16;
	stream->write32(&buf, sizeof(LightChunkData));

	s_plglist.streamWrite(stream, this);
	return true;
}